

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall
ktxValidator::logger::addIssue<_khr_df_primaries_e>
          (logger *this,severity severity,issue *issue,_khr_df_primaries_e args)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  void *this_00;
  max_issues_exceeded *this_01;
  undefined8 uVar5;
  int in_ESI;
  uint *in_RDI;
  uint32_t j_2;
  uint32_t j_1;
  uint32_t ll;
  uint32_t lei;
  uint32_t lsi;
  uint32_t line;
  size_t nchars;
  string message;
  stringstream oss;
  uint32_t j;
  uint32_t indent;
  uint32_t baseIndent;
  fatal *in_stack_fffffffffffffdb0;
  uint local_230;
  uint local_200;
  uint local_1fc;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long local_1e8;
  string local_1e0 [48];
  stringstream local_1b0 [132];
  _khr_df_primaries_e in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  stringstream *in_stack_fffffffffffffee0;
  uint local_28;
  uint local_24;
  
  if ((in_RDI[1] & 1) == 0) {
    if ((in_RDI[4] & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Issues in: ");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 6));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      *(undefined1 *)(in_RDI + 4) = 1;
    }
    local_24 = 0;
    if (*in_RDI <= in_RDI[2] + in_RDI[3]) {
      this_01 = (max_issues_exceeded *)__cxa_allocate_exception(0x10);
      max_issues_exceeded::max_issues_exceeded(this_01);
      __cxa_throw(this_01,&max_issues_exceeded::typeinfo,max_issues_exceeded::~max_issues_exceeded);
    }
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      std::ostream::put(-0x30);
    }
    if (in_ESI == 0) {
      std::operator<<((ostream *)&std::cout,"WARNING: ");
      local_24 = 0xd;
      in_RDI[3] = in_RDI[3] + 1;
    }
    else if (in_ESI == 1) {
      std::operator<<((ostream *)&std::cout,"ERROR: ");
      local_24 = 0xb;
      in_RDI[2] = in_RDI[2] + 1;
    }
    else if (in_ESI == 2) {
      std::operator<<((ostream *)&std::cout,"FATAL: ");
      local_24 = 0xb;
    }
    std::__cxx11::stringstream::stringstream(local_1b0);
    sprintf<_khr_df_primaries_e>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    std::__cxx11::stringstream::str();
    local_1e8 = std::__cxx11::string::size();
    local_1ec = 0;
    local_1f0 = 0;
    for (; 0x50 < local_1e8 + (ulong)local_24; local_1e8 = local_1e8 - (ulong)uVar1) {
      local_1f4 = (local_1f0 + 0x4f) - local_24;
      while (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1e0), *pcVar3 != ' ') {
        local_1f4 = local_1f4 + -1;
      }
      uVar1 = local_1f4 - local_1f0;
      local_1fc = 0;
      while( true ) {
        if (local_1ec == 0) {
          local_230 = 0;
        }
        else {
          local_230 = local_24;
        }
        if (local_230 <= local_1fc) break;
        std::ostream::put(-0x30);
        local_1fc = local_1fc + 1;
      }
      lVar4 = std::__cxx11::string::operator[]((ulong)local_1e0);
      this_00 = (void *)std::ostream::write((char *)&std::cout,lVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_1f0 = local_1f4 + 1;
      local_1ec = local_1ec + 1;
    }
    local_200 = 0;
    while( true ) {
      uVar1 = 0;
      if (local_1ec != 0) {
        uVar1 = 4;
      }
      if (uVar1 <= local_200) break;
      std::ostream::put(-0x30);
      local_200 = local_200 + 1;
    }
    lVar4 = std::__cxx11::string::operator[]((ulong)local_1e0);
    std::ostream::write((char *)&std::cout,lVar4);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  else if (in_ESI == 0) {
    in_RDI[3] = in_RDI[3] + 1;
  }
  else if (in_ESI == 1) {
    in_RDI[2] = in_RDI[2] + 1;
  }
  if (in_ESI == 2) {
    uVar5 = __cxa_allocate_exception(0x10);
    fatal::fatal(in_stack_fffffffffffffdb0);
    __cxa_throw(uVar5,&fatal::typeinfo,fatal::~fatal);
  }
  return;
}

Assistant:

void
ktxValidator::logger::addIssue(severity severity, issue issue, Args ... args)
{
    if (quiet) {
        switch (severity) {
          case eError:
            errorCount++;
            break;
          case eFatal:
            break;
          case eWarning:
            warningCount++;
            break;
        }
    } else {
        if (!headerWritten) {
            cout << "Issues in: " << nameOfFileBeingValidated << std::endl;
            headerWritten = true;
        }
        const uint32_t baseIndent = 4;
        uint32_t indent = 0;
        if ((errorCount + warningCount ) < maxIssues) {
            for (uint32_t j = 0; j < baseIndent; j++)
              cout.put(' ');
            switch (severity) {
              case eError:
                cout << "ERROR: ";
                indent = baseIndent + 7;
                errorCount++;
                break;
              case eFatal:
                cout << "FATAL: ";
                indent = baseIndent + 7;
                break;
              case eWarning:
                cout << "WARNING: ";
                indent = baseIndent + 9;
                warningCount++;
                break;
            }
            //fprintf(stdout, issue.message.c_str(), args...);
            std::stringstream oss;
            sprintf(oss, issue.message, args...);
            // Wrap lines on spaces.
            std::string message = oss.str();
            size_t nchars = message.size();
            uint32_t line = 0;
            uint32_t lsi = 0;  // line start index.
            uint32_t lei; // line end index
            while (nchars + indent > 80) {
                uint32_t ll; // line length
                lei = lsi + 79 - indent;
                while (message[lei] != ' ') lei--;
                ll = lei - lsi;
                for (uint32_t j = 0; j < (line ? indent : 0); j++) {
                    cout.put(' ');
                }
                cout.write(&message[lsi], ll) << std::endl;
                lsi = lei + 1; // +1 to skip the space
                nchars -= ll;
                line++;
            }
            for (uint32_t j = 0; j < (line ? baseIndent : 0); j++) {
                cout.put(' ');
            }
            cout.write(&message[lsi], nchars);
            cout << std::endl;
        } else {
            throw max_issues_exceeded();
        }
    }
    if (severity == eFatal)
        throw fatal();
}